

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LimitSegments.cpp
# Opt level: O1

void __thiscall wasm::LimitSegments::run(LimitSegments *this,Module *module)

{
  _Alloc_hider __nptr;
  bool bVar1;
  int *piVar2;
  ulong uVar3;
  undefined8 uVar4;
  Index maxDataSegments;
  pointer local_a0;
  string local_98;
  string local_78;
  string local_58;
  int local_34;
  
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"limit-segments","");
  bVar1 = Pass::hasArgument(&this->super_Pass,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  maxDataSegments = 100000;
  if (bVar1) {
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"limit-segments","");
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
    Pass::getArgument(&local_58,&this->super_Pass,&local_98,&local_78);
    __nptr._M_p = local_58._M_dataplus._M_p;
    piVar2 = __errno_location();
    local_34 = *piVar2;
    *piVar2 = 0;
    uVar3 = strtoul(__nptr._M_p,&local_a0,10);
    maxDataSegments = (Index)uVar3;
    if (local_a0 == __nptr._M_p) {
      uVar4 = std::__throw_invalid_argument("stoul");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      _Unwind_Resume(uVar4);
    }
    if (*piVar2 == 0) {
      *piVar2 = local_34;
    }
    else if (*piVar2 == 0x22) {
      std::__throw_out_of_range("stoul");
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
  }
  bVar1 = MemoryUtils::ensureLimitedSegments(module,maxDataSegments);
  if (!bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Unable to merge segments. ",0x1a);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"wasm VMs may not accept this binary",0x23);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x18);
    std::ostream::put(-0x18);
    std::ostream::flush();
  }
  return;
}

Assistant:

void run(Module* module) override {
    Index maxDataSegments;
    if (hasArgument("limit-segments")) {
      maxDataSegments = std::stoul(getArgument("limit-segments", ""));
    } else {
      maxDataSegments = WebLimitations::MaxDataSegments;
    }
    if (!MemoryUtils::ensureLimitedSegments(*module, maxDataSegments)) {
      std::cerr << "Unable to merge segments. "
                << "wasm VMs may not accept this binary" << std::endl;
    }
  }